

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O2

bool __thiscall
UnixMakefileGenerator::writeObjectsPart
          (UnixMakefileGenerator *this,QTextStream *t,bool do_incremental)

{
  QMakeProject *pQVar1;
  long lVar2;
  qsizetype qVar3;
  char cVar4;
  ProStringList *paths;
  ProStringList *pPVar5;
  ProString *pPVar6;
  QTextStream *pQVar7;
  undefined7 in_register_00000011;
  bool bVar8;
  ProString *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d0;
  QRegularExpression regexp;
  QArrayDataPointer<ProString> local_a0;
  QArrayDataPointer<ProString> local_88 [2];
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_88,"OBJECTS");
  paths = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
  if ((int)CONCAT71(in_register_00000011,do_incremental) == 0) {
    pQVar7 = (QTextStream *)QTextStream::operator<<(t,"OBJECTS       = ");
    MakefileGenerator::escapeDependencyPaths
              ((ProStringList *)&local_a0,&this->super_MakefileGenerator,paths);
    MakefileGenerator::valList
              ((QString *)local_88,&this->super_MakefileGenerator,(ProStringList *)&local_a0);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_88);
    Qt::endl(pQVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_a0);
    bVar8 = false;
    goto LAB_001908a2;
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_88,"QMAKE_INCREMENTAL");
  pPVar5 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
  local_88[0].d = (Data *)0x0;
  local_88[0].ptr = (ProString *)0x0;
  local_88[0].size = 0;
  QTextStream::operator<<(t,"OBJECTS       = ");
  pPVar6 = (paths->super_QList<ProString>).d.ptr;
  for (this_00 = pPVar6; qVar3 = local_88[0].size, lVar2 = (paths->super_QList<ProString>).d.size,
      this_00 != pPVar6 + lVar2; this_00 = this_00 + 1) {
    pPVar6 = (pPVar5->super_QList<ProString>).d.ptr;
    bVar8 = false;
    do {
      if (pPVar6 == (pPVar5->super_QList<ProString>).d.ptr + (pPVar5->super_QList<ProString>).d.size
         ) break;
      _regexp = (Data *)0xaaaaaaaaaaaaaaaa;
      ProString::toQString((QString *)&local_a0,pPVar6);
      QRegularExpression::fromWildcard(&regexp,local_a0.size,local_a0.ptr,1,1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      ProString::toQString((QString *)&local_a0,this_00);
      cVar4 = QString::contains((QRegularExpression *)&local_a0,(QRegularExpressionMatch *)&regexp);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      if (cVar4 != '\0') {
        QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)local_88,this_00);
        bVar8 = true;
      }
      QRegularExpression::~QRegularExpression(&regexp);
      pPVar6 = pPVar6 + 1;
    } while (cVar4 == '\0');
    if (!bVar8) {
      pQVar7 = (QTextStream *)QTextStream::operator<<(t,"\\\n\t\t");
      operator<<(pQVar7,this_00);
    }
    pPVar6 = (paths->super_QList<ProString>).d.ptr;
  }
  if (local_88[0].size == lVar2) {
    MakefileGenerator::escapeFilePaths
              ((ProStringList *)&regexp,&this->super_MakefileGenerator,(ProStringList *)local_88);
    QString::QString((QString *)&local_d0," \\\n\t\t");
    ProStringList::join((QString *)&local_a0,(ProStringList *)&regexp,(QString *)&local_d0);
    pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_a0);
    Qt::endl(pQVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&regexp);
LAB_00190896:
    bVar8 = false;
  }
  else {
    Qt::endl(t);
    if (qVar3 == 0) goto LAB_00190896;
    pQVar7 = (QTextStream *)QTextStream::operator<<(t,"INCREMENTAL_OBJECTS = ");
    MakefileGenerator::escapeFilePaths
              ((ProStringList *)&regexp,&this->super_MakefileGenerator,(ProStringList *)local_88);
    QString::QString((QString *)&local_d0," \\\n\t\t");
    ProStringList::join((QString *)&local_a0,(ProStringList *)&regexp,(QString *)&local_d0);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_a0);
    Qt::endl(pQVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&regexp);
    bVar8 = true;
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(local_88);
LAB_001908a2:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool UnixMakefileGenerator::writeObjectsPart(QTextStream &t, bool do_incremental)
{
    bool src_incremental = false;
    QString objectsLinkLine;
    const ProStringList &objs = project->values("OBJECTS");
    if (do_incremental) {
        const ProStringList &incrs = project->values("QMAKE_INCREMENTAL");
        ProStringList incrs_out;
        t << "OBJECTS       = ";
        for (ProStringList::ConstIterator objit = objs.begin(); objit != objs.end(); ++objit) {
            bool increment = false;
            for (ProStringList::ConstIterator incrit = incrs.begin(); incrit != incrs.end(); ++incrit) {
                auto regexp = QRegularExpression::fromWildcard((*incrit).toQString(), Qt::CaseSensitive,
                                                               QRegularExpression::UnanchoredWildcardConversion);
                if ((*objit).toQString().contains(regexp)) {
                    increment = true;
                    incrs_out.append((*objit));
                    break;
                }
            }
            if (!increment)
                t << "\\\n\t\t" << (*objit);
        }
        if (incrs_out.size() == objs.size()) { //we just switched places, no real incrementals to be done!
            t << escapeFilePaths(incrs_out).join(QString(" \\\n\t\t")) << Qt::endl;
        } else if (!incrs_out.size()) {
            t << Qt::endl;
        } else {
            src_incremental = true;
            t << Qt::endl;
            t << "INCREMENTAL_OBJECTS = "
              << escapeFilePaths(incrs_out).join(QString(" \\\n\t\t")) << Qt::endl;
        }
    } else {
        t << "OBJECTS       = " << valList(escapeDependencyPaths(objs)) << Qt::endl;
    }
    return src_incremental;
}